

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O3

void __thiscall xmrig::OclCnRunner::run(OclCnRunner *this,uint32_t nonce,uint32_t *hashOutput)

{
  pointer ppCVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppCVar3;
  ulong uVar4;
  size_t threads;
  size_t i;
  long lVar5;
  ulong worksize;
  
  iVar2 = (*(this->super_OclBaseRunner).super_IOclRunner._vptr_IOclRunner[6])();
  worksize = (ulong)*(uint *)(CONCAT44(extraout_var,iVar2) + 0xd8);
  uVar4 = (worksize + (this->super_OclBaseRunner).m_intensity) - 1;
  lVar5 = 0;
  do {
    OclBaseRunner::enqueueWriteBuffer
              (&this->super_OclBaseRunner,
               (this->m_branches).super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar5],0,
               (ulong)(this->super_OclBaseRunner).m_intensity << 2,4,&run::zero);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  threads = uVar4 - uVar4 % worksize;
  OclBaseRunner::enqueueWriteBuffer
            (&this->super_OclBaseRunner,(this->super_OclBaseRunner).m_output,0,0x3fc,4,&run::zero);
  Cn1Kernel::enqueue(this->m_cn1,(this->super_OclBaseRunner).m_queue,nonce,threads,worksize);
  Cn2Kernel::enqueue(this->m_cn2,(this->super_OclBaseRunner).m_queue,nonce,threads);
  ppCVar1 = (this->m_branchKernels).
            super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar3 = (this->m_branchKernels).
                 super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar1;
      ppCVar3 = ppCVar3 + 1) {
    CnBranchKernel::enqueue(*ppCVar3,(this->super_OclBaseRunner).m_queue,nonce,threads,worksize);
  }
  OclBaseRunner::finalize(&this->super_OclBaseRunner,hashOutput);
  return;
}

Assistant:

void xmrig::OclCnRunner::run(uint32_t nonce, uint32_t *hashOutput)
{
    static const cl_uint zero = 0;

    const size_t w_size = data().thread.worksize();
    const size_t g_thd  = ((m_intensity + w_size - 1u) / w_size) * w_size;

    assert(g_thd % w_size == 0);

    for (size_t i = 0; i < BRANCH_MAX; ++i) {
        enqueueWriteBuffer(m_branches[i], CL_FALSE, sizeof(cl_uint) * m_intensity, sizeof(cl_uint), &zero);
    }

    enqueueWriteBuffer(m_output, CL_FALSE, sizeof(cl_uint) * 0xFF, sizeof(cl_uint), &zero);

    m_cn1->enqueue(m_queue, nonce, g_thd, w_size);
    m_cn2->enqueue(m_queue, nonce, g_thd);

    for (auto kernel : m_branchKernels) {
        kernel->enqueue(m_queue, nonce, g_thd, w_size);
    }

    finalize(hashOutput);
}